

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  size_t sVar1;
  size_t End;
  StringRef SVar2;
  size_t NextTab;
  uint OutCol;
  uint e;
  uint i;
  raw_ostream *S_local;
  StringRef LineContents_local;
  
  LineContents_local.Data = (char *)LineContents.Length;
  S_local = (raw_ostream *)LineContents.Data;
  OutCol = 0;
  sVar1 = llvm::StringRef::size((StringRef *)&S_local);
  NextTab._4_4_ = 0;
  do {
    if (OutCol == (uint)sVar1) {
LAB_0289300d:
      llvm::raw_ostream::operator<<(S,'\n');
      return;
    }
    End = llvm::StringRef::find((StringRef *)&S_local,'\t',(ulong)OutCol);
    if (End == 0xffffffffffffffff) {
      SVar2 = llvm::StringRef::drop_front((StringRef *)&S_local,(ulong)OutCol);
      llvm::raw_ostream::operator<<(S,SVar2);
      goto LAB_0289300d;
    }
    SVar2 = llvm::StringRef::slice((StringRef *)&S_local,(ulong)OutCol,End);
    llvm::raw_ostream::operator<<(S,SVar2);
    NextTab._4_4_ = NextTab._4_4_ + ((int)End - OutCol);
    do {
      llvm::raw_ostream::operator<<(S,' ');
      NextTab._4_4_ = NextTab._4_4_ + 1;
    } while ((NextTab._4_4_ & 7) != 0);
    OutCol = (int)End + 1;
  } while( true );
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    size_t NextTab = LineContents.find('\t', i);
    // If there were no tabs left, print the rest, we are done.
    if (NextTab == StringRef::npos) {
      S << LineContents.drop_front(i);
      break;
    }

    // Otherwise, print from i to NextTab.
    S << LineContents.slice(i, NextTab);
    OutCol += NextTab - i;
    i = NextTab;

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}